

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cn-create.c
# Opt level: O0

cn_cbor * cn_cbor_string_create(char *data,cn_cbor_errback *errp)

{
  size_t sVar1;
  cn_cbor *ret;
  cn_cbor_errback *errp_local;
  char *data_local;
  
  if (errp != (cn_cbor_errback *)0x0) {
    errp->err = CN_CBOR_NO_ERROR;
  }
  data_local = (char *)calloc(1,0x38);
  if (data_local == (char *)0x0) {
    if (errp != (cn_cbor_errback *)0x0) {
      errp->err = CN_CBOR_ERR_OUT_OF_MEMORY;
    }
    data_local = (char *)0x0;
  }
  else {
    data_local[0] = '\a';
    data_local[1] = '\0';
    data_local[2] = '\0';
    data_local[3] = '\0';
    sVar1 = strlen(data);
    *(int *)(data_local + 0x10) = (int)sVar1;
    *(char **)(data_local + 8) = data;
  }
  return (cn_cbor *)data_local;
}

Assistant:

MYLIB_EXPORT
cn_cbor* cn_cbor_string_create(const char* data
                               CBOR_CONTEXT,
                               cn_cbor_errback *errp)
{
  cn_cbor* ret;
  INIT_CB(ret);

  ret->type = CN_CBOR_TEXT;
  ret->length = strlen(data);
  ret->v.str = data;

  return ret;
}